

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::int_writer
          (int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *this,
          basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *w,__int128 value,
          basic_format_specs<wchar_t> *s)

{
  char cVar1;
  byte bVar2;
  long in_RCX;
  basic_format_specs<wchar_t> *in_R8;
  
  this->writer = w;
  this->specs = in_R8;
  *(long *)((long)&this->abs_value + 8) = in_RCX;
  *(basic_format_specs<wchar_t> **)&this->abs_value = s;
  this->prefix_size = 0;
  if (-1 < in_RCX) {
    bVar2 = (byte)in_R8->field_0x9 >> 4 & 7;
    if (1 < bVar2) {
      cVar1 = ' ';
      if (bVar2 == 2) {
        cVar1 = '+';
      }
      this->prefix[0] = cVar1;
      this->prefix_size = 1;
    }
    return;
  }
  this->prefix[0] = '-';
  this->prefix_size = 1;
  *(long *)&this->abs_value = -(long)s;
  *(ulong *)((long)&this->abs_value + 8) =
       -(ulong)(s != (basic_format_specs<wchar_t> *)0x0) - in_RCX;
  return;
}

Assistant:

int_writer(basic_writer<Range>& w, Int value, const Specs& s)
        : writer(w),
          specs(s),
          abs_value(static_cast<unsigned_type>(value)),
          prefix_size(0) {
      if (is_negative(value)) {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
      } else if (specs.sign != sign::none && specs.sign != sign::minus) {
        prefix[0] = specs.sign == sign::plus ? '+' : ' ';
        ++prefix_size;
      }
    }